

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilMaj.c
# Opt level: O0

int Gem_GroupVarRemove(int Groups,int i)

{
  uint local_18;
  int Mask;
  int i_local;
  int Groups_local;
  
  if (i == 0) {
    local_18 = 0;
  }
  else {
    local_18 = Abc_InfoMask(i);
  }
  if (-1 < i) {
    if ((Groups >> ((byte)i & 0x1f) & 1U) != 0) {
      return Groups & local_18 | (int)(Groups & (local_18 ^ 0xffffffff)) >> 1;
    }
    __assert_fail("(Groups >> i) & 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/extra/extraUtilMaj.c"
                  ,0xa2,"int Gem_GroupVarRemove(int, int)");
  }
  __assert_fail("i >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/extra/extraUtilMaj.c"
                ,0xa1,"int Gem_GroupVarRemove(int, int)");
}

Assistant:

int Gem_GroupVarRemove( int Groups, int i ) // remove i-th var
{
    int Mask = i ? Abc_InfoMask( i ) : 0;
    assert( i >= 0 );
    assert( (Groups >> i) & 1 );
    return (Groups & Mask) | ((Groups & ~Mask) >> 1);
}